

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool cs_impl::file_system::chmod_r(string *path_input,string *mode)

{
  initializer_list<char> iVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dir;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  undefined1 *local_b0;
  string local_a8 [24];
  set_t<char> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_75 [2];
  undefined1 local_30 [32];
  string *local_10;
  byte local_1;
  
  local_75[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = 0x2f;
  local_75[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_1_ = 0x5c;
  local_75[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._5_8_ =
       (long)&local_75[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3;
  local_75[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._13_8_ = 2;
  this = local_75;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  iVar1._M_len = in_stack_ffffffffffffff20;
  iVar1._M_array = (iterator)in_stack_ffffffffffffff18;
  phmap::flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
  raw_hash_set((flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar1,(size_t)this,
               (hasher *)in_RDI,(key_equal *)this,in_stack_ffffffffffffff30);
  cs_system_impl::split(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  phmap::flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
  ~flat_hash_set((flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                  *)0x20ff79);
  std::allocator<char>::~allocator((allocator<char> *)local_75);
  std::__cxx11::string::string(local_a8);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (*pcVar4 != '/') {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
      if (*pcVar4 != '\\') goto LAB_0021004e;
    }
    std::__cxx11::string::operator=(local_a8,'/');
  }
LAB_0021004e:
  local_b0 = local_30;
  local_b8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(this);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this);
    if (!bVar2) {
      local_1 = 1;
LAB_00210141:
      uVar5 = 1;
      std::__cxx11::string::~string(local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(uVar5,in_stack_ffffffffffffff10));
      return (bool)(local_1 & 1);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_b8);
    std::operator+(in_stack_ffffffffffffff18,(char)((uint)in_stack_ffffffffffffff14 >> 0x18));
    std::__cxx11::string::operator+=(local_a8,(string *)&stack0xffffffffffffff18);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    cs_system_impl::parse_mode
              ((string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    bVar2 = cs_system_impl::chmod_impl(in_RDI,(uint)((ulong)this >> 0x20));
    if (!bVar2) {
      local_1 = 0;
      goto LAB_00210141;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_b8);
  } while( true );
}

Assistant:

bool chmod_r(const std::string &path_input, const std::string &mode)
		{
			auto dirs = cs_system_impl::split(path_input, {'/', '\\'});
			std::string path;
			if (path_input.size() > 0 && (path_input[0] == '/' || path_input[0] == '\\'))
				path = cs::path_separator;
			for (auto &dir: dirs) {
				path += dir + cs::path_separator;
				// DO NOT SKIP when dir is a directory
				// directory has permissions too
				if (!cs_system_impl::chmod_impl(path, cs_system_impl::parse_mode(mode)))
					return false;
			}
			return true;
		}